

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetNonlinearSolver(void *arkode_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    iVar1 = 0x122;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 299;
  }
  else {
    if (*(code **)((long)arkode_mem + 0x160) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x160))();
      return iVar1;
    }
    msgfmt = "time-stepping module does not support this function";
    error_code = -0x30;
    iVar1 = 0x137;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetNonlinearSolver",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetNonlinearSolver(void* arkode_mem, SUNNonlinearSolver NLS)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine (if provided) */
  if (ark_mem->step_setnonlinearsolver)
  {
    return (ark_mem->step_setnonlinearsolver(arkode_mem, NLS));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}